

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginFunctionBody
          (BinaryReaderInterp *this,Index index,Offset size)

{
  pointer pLVar1;
  FuncDesc *pFVar2;
  Index IVar3;
  Offset OVar4;
  Result RVar5;
  Location loc;
  
  IVar3 = num_func_imports(this);
  this->func_ = (this->module_->funcs).
                super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
                _M_impl.super__Vector_impl_data._M_start + (index - IVar3);
  OVar4 = Istream::end(this->istream_);
  this->func_->code_offset = OVar4;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)&this->depth_fixups_);
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->label_stack_).
      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->label_stack_).
    super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  FixupMap::Resolve(&this->func_fixups_,this->istream_,index - IVar3);
  loc.field_1._8_8_ = (ulong)(uint)loc.field_1._12_4_ << 0x20;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar5 = SharedValidator::BeginFunctionBody(&this->validator_,&loc,index);
  if (RVar5.enum_ != Error) {
    PushLabel(this,Try,0xffffffff,0xffffffff,
              (u32)(((long)(this->func_->handlers).
                           super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->func_->handlers).
                          super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38));
    pFVar2 = this->func_;
    loc.filename._M_len = loc.filename._M_len & 0xffffffff00000000;
    OVar4 = Istream::end(this->istream_);
    loc.filename._M_len = CONCAT44(OVar4,(undefined4)loc.filename._M_len);
    loc.filename._M_str = (char *)CONCAT44(loc.filename._M_str._4_4_,0xffffffff);
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    loc.field_1._8_8_ = 0;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::
    emplace_back<wabt::interp::HandlerDesc>(&pFVar2->handlers,(HandlerDesc *)&loc);
    std::_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
    ~_Vector_base((_Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *
                  )&loc.field_1.field_0);
  }
  return (Result)(uint)(RVar5.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginFunctionBody(Index index, Offset size) {
  Index defined_index = index - num_func_imports();
  func_ = &module_.funcs[defined_index];
  func_->code_offset = istream_.end();

  depth_fixups_.Clear();
  label_stack_.clear();

  func_fixups_.Resolve(istream_, defined_index);

  CHECK_RESULT(validator_.BeginFunctionBody(GetLocation(), index));

  // Push implicit func label (equivalent to return).
  // With exception handling it acts as a catch-less try block, which is
  // needed to support delegating to the caller of a function using the
  // try-delegate instruction.
  PushLabel(LabelKind::Try, Istream::kInvalidOffset, Istream::kInvalidOffset,
            func_->handlers.size());
  func_->handlers.push_back(HandlerDesc{HandlerKind::Catch,
                                        istream_.end(),
                                        Istream::kInvalidOffset,
                                        {},
                                        {Istream::kInvalidOffset},
                                        static_cast<u32>(func_->locals.size()),
                                        0});
  return Result::Ok;
}